

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

BYTE * __thiscall FBehavior::NextChunk(FBehavior *this,BYTE *chunk)

{
  bool bVar1;
  int *piStack_20;
  DWORD id;
  BYTE *chunk_local;
  FBehavior *this_local;
  
  piStack_20 = (int *)(chunk + (*(int *)(chunk + 4) + 8));
  while( true ) {
    bVar1 = false;
    if (piStack_20 != (int *)0x0) {
      bVar1 = piStack_20 < this->Data + this->DataSize;
    }
    if (!bVar1) break;
    if (*piStack_20 == *(int *)chunk) {
      return (BYTE *)piStack_20;
    }
    piStack_20 = (int *)((long)piStack_20 + (ulong)(piStack_20[1] + 8));
  }
  return (BYTE *)0x0;
}

Assistant:

BYTE *FBehavior::NextChunk (BYTE *chunk) const
{
	DWORD id = *(DWORD *)chunk;
	chunk += LittleLong(((DWORD *)chunk)[1]) + 8;
	while (chunk != NULL && chunk < Data + DataSize)
	{
		if (((DWORD *)chunk)[0] == id)
		{
			return chunk;
		}
		chunk += LittleLong(((DWORD *)chunk)[1]) + 8;
	}
	return NULL;
}